

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O0

void Ssc_GiaSavePiPattern(Gia_Man_t *p,Vec_Int_t *vPat)

{
  Vec_Wrd_t *p_00;
  int iVar1;
  int iVar2;
  int local_24;
  word *pwStack_20;
  int i;
  word *pSimPi;
  Vec_Int_t *vPat_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vPat);
  iVar2 = Gia_ManCiNum(p);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(vPat) == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                  ,0x99,"void Ssc_GiaSavePiPattern(Gia_Man_t *, Vec_Int_t *)");
  }
  iVar1 = p->iPatsPi;
  iVar2 = Gia_ObjSimWords(p);
  if (iVar1 == iVar2 << 6) {
    p_00 = p->vSimsPi;
    iVar1 = Gia_ManCiNum(p);
    Vec_WrdDoubleSimInfo(p_00,iVar1);
  }
  iVar1 = p->iPatsPi;
  iVar2 = Gia_ObjSimWords(p);
  if (iVar1 < iVar2 * 0x40) {
    pwStack_20 = Gia_ObjSimPi(p,0);
    local_24 = 0;
    while( true ) {
      iVar1 = Gia_ManCiNum(p);
      if (iVar1 <= local_24) break;
      iVar1 = Vec_IntEntry(vPat,local_24);
      if (iVar1 != 0) {
        Abc_InfoSetBit((uint *)pwStack_20,p->iPatsPi);
      }
      local_24 = local_24 + 1;
      iVar1 = Gia_ObjSimWords(p);
      pwStack_20 = pwStack_20 + iVar1;
    }
    p->iPatsPi = p->iPatsPi + 1;
    return;
  }
  __assert_fail("p->iPatsPi < 64 * Gia_ObjSimWords(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                ,0x9c,"void Ssc_GiaSavePiPattern(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

void Ssc_GiaSavePiPattern( Gia_Man_t * p, Vec_Int_t * vPat )
{
    word * pSimPi;
    int i;
    assert( Vec_IntSize(vPat) == Gia_ManCiNum(p) );
    if ( p->iPatsPi == 64 * Gia_ObjSimWords(p) )
        Vec_WrdDoubleSimInfo( p->vSimsPi, Gia_ManCiNum(p) );
    assert( p->iPatsPi < 64 * Gia_ObjSimWords(p) );
    pSimPi = Gia_ObjSimPi( p, 0 );
    for ( i = 0; i < Gia_ManCiNum(p); i++, pSimPi += Gia_ObjSimWords(p) )
        if ( Vec_IntEntry(vPat, i) )
            Abc_InfoSetBit( (unsigned *)pSimPi, p->iPatsPi );
    p->iPatsPi++;
}